

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_file_handle.cpp
# Opt level: O2

void __thiscall
duckdb::CSVFileHandle::CSVFileHandle
          (CSVFileHandle *this,DBConfig *config,
          unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
          *file_handle_p,OpenFileInfo *file_p,CSVReaderOptions *options)

{
  unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> *this_00;
  bool bVar1;
  int iVar2;
  pointer pFVar3;
  idx_t iVar4;
  
  *(undefined8 *)((long)&(this->main_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->main_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->main_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->main_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->main_mutex).super___mutex_base._M_mutex + 8) = 0;
  this->compression_type = options->compression;
  (this->file_handle).super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>
  ._M_t.super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
  super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl =
       (file_handle_p->
       super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>)._M_t.
       super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
       super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl;
  (file_handle_p->super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>).
  _M_t.super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
  super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl = (FileHandle *)0x0;
  this_00 = &this->file_handle;
  CSVEncoder::CSVEncoder
            (&this->encoder,config,&options->encoding,(options->buffer_size_option).value);
  OpenFileInfo::OpenFileInfo(&this->file,file_p);
  this->can_seek = false;
  this->on_disk_file = false;
  this->is_pipe = false;
  this->uncompressed_bytes_read = 0;
  this->file_size = 0;
  *(undefined8 *)((long)&this->file_size + 1) = 0;
  *(undefined8 *)((long)&this->requested_bytes + 1) = 0;
  pFVar3 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::operator->
                     (this_00);
  bVar1 = FileHandle::CanSeek(pFVar3);
  this->can_seek = bVar1;
  pFVar3 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::operator->
                     (this_00);
  bVar1 = FileHandle::OnDiskFile(pFVar3);
  this->on_disk_file = bVar1;
  pFVar3 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::operator->
                     (this_00);
  iVar4 = FileHandle::GetFileSize(pFVar3);
  this->file_size = iVar4;
  pFVar3 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::operator->
                     (this_00);
  bVar1 = FileHandle::IsPipe(pFVar3);
  this->is_pipe = bVar1;
  pFVar3 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::operator->
                     (this_00);
  iVar2 = (*pFVar3->_vptr_FileHandle[3])(pFVar3);
  this->compression_type = (FileCompressionType)iVar2;
  return;
}

Assistant:

CSVFileHandle::CSVFileHandle(DBConfig &config, unique_ptr<FileHandle> file_handle_p, const OpenFileInfo &file_p,
                             const CSVReaderOptions &options)
    : compression_type(options.compression), file_handle(std::move(file_handle_p)),
      encoder(config, options.encoding, options.buffer_size_option.GetValue()), file(file_p) {
	can_seek = file_handle->CanSeek();
	on_disk_file = file_handle->OnDiskFile();
	file_size = file_handle->GetFileSize();
	is_pipe = file_handle->IsPipe();
	compression_type = file_handle->GetFileCompressionType();
}